

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O2

void __thiscall
avro::EnumParser::EnumParser
          (EnumParser *this,ResolverFactory *factory,NodePtr *writer,NodePtr *reader,
          CompoundLayout *offsets)

{
  int iVar1;
  int iVar2;
  const_reference pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t i;
  ulong uVar4;
  size_t readerIndex;
  size_t local_38;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_parse_001f0170;
  pTVar3 = boost::
           ptr_sequence_adapter<avro::Layout,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
           ::at((ptr_sequence_adapter<avro::Layout,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
                 *)(offsets + 0x10),0);
  this->offset_ = *(size_t *)(pTVar3 + 8);
  iVar1 = (*reader->px->_vptr_Node[7])();
  this->readerSize_ = CONCAT44(extraout_var,iVar1);
  (this->mapping_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mapping_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mapping_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = (*writer->px->_vptr_Node[7])();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->mapping_,CONCAT44(extraout_var_00,iVar1));
  for (uVar4 = 0; CONCAT44(extraout_var_00,iVar1) != uVar4; uVar4 = uVar4 + 1) {
    iVar2 = (*writer->px->_vptr_Node[8])(writer->px,uVar4 & 0xffffffff);
    local_38 = this->readerSize_;
    (*reader->px->_vptr_Node[9])(reader->px,CONCAT44(extraout_var_01,iVar2),&local_38);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->mapping_,&local_38)
    ;
  }
  return;
}

Assistant:

EnumParser(ResolverFactory &factory, const NodePtr &writer, const NodePtr &reader, const CompoundLayout &offsets) :
        Resolver(),
        offset_(offsets.at(0).offset()),
        readerSize_(reader->names())
    { 
        const size_t writerSize = writer->names();

        mapping_.reserve(writerSize);

        for(size_t i = 0; i < writerSize; ++i) {
            const std::string &name = writer->nameAt(i);
            size_t readerIndex = readerSize_;
            reader->nameIndex(name, readerIndex);
            mapping_.push_back(readerIndex);
        }
    }